

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O3

Int2_Man_t * Int2_ManStart(sat_solver2 *pSat,int *pGloVars,int nGloVars)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Int2_Man_t *pIVar3;
  Vec_Int_t *pVVar4;
  int *__dest;
  int *__s;
  Gia_Man_t *p;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int iVar8;
  
  pIVar3 = (Int2_Man_t *)calloc(1,0x20);
  pIVar3->pSat = pSat;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = nGloVars;
  pVVar4->nCap = nGloVars;
  __dest = (int *)malloc((long)nGloVars * 4);
  pVVar4->pArray = __dest;
  memcpy(__dest,pGloVars,(long)nGloVars * 4);
  pIVar3->vGloVars = pVVar4;
  pVVar4 = (Vec_Int_t *)calloc(1,0x10);
  if (nGloVars != 0) {
    iVar8 = *__dest;
    if (1 < nGloVars) {
      uVar7 = 1;
      do {
        if (iVar8 <= __dest[uVar7]) {
          iVar8 = __dest[uVar7];
        }
        uVar7 = uVar7 + 1;
      } while ((uint)nGloVars != uVar7);
    }
    uVar1 = iVar8 + 1;
    if (iVar8 < 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((ulong)uVar1 << 2);
      pVVar4->pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = uVar1;
      memset(__s,0xff,(ulong)uVar1 << 2);
    }
    pVVar4->nSize = uVar1;
    if (0 < nGloVars) {
      uVar7 = 0;
      do {
        uVar1 = __dest[uVar7];
        if ((ulong)uVar1 != 0xffffffff) {
          if (((int)uVar1 < 0) || (iVar8 < (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar1] = (int)uVar7;
        }
        uVar7 = uVar7 + 1;
      } while ((uint)nGloVars != uVar7);
    }
  }
  pIVar3->vVar2Glo = pVVar4;
  p = Gia_ManStart(nGloVars * 10);
  pIVar3->pGia = p;
  pcVar5 = (char *)malloc(0xc);
  builtin_strncpy(pcVar5,"interpolant",0xc);
  p->pName = pcVar5;
  if (0 < nGloVars) {
    do {
      pGVar6 = Gia_ManAppendObj(p);
      uVar7 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
LAB_008ea756:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar6 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar6)) goto LAB_008ea756;
      nGloVars = nGloVars + -1;
    } while (nGloVars != 0);
  }
  Gia_ManHashStart(p);
  return pIVar3;
}

Assistant:

Int2_Man_t * Int2_ManStart( sat_solver2 * pSat, int * pGloVars, int nGloVars )
{
    Int2_Man_t * p;
    int i;
    p = ABC_CALLOC( Int2_Man_t, 1 );
    p->pSat     = pSat;
    p->vGloVars = Vec_IntAllocArrayCopy( pGloVars, nGloVars );
    p->vVar2Glo = Vec_IntInvert( p->vGloVars, -1 );
    p->pGia     = Gia_ManStart( 10 * Vec_IntSize(p->vGloVars) );
    p->pGia->pName = Abc_UtilStrsav( "interpolant" );
    for ( i = 0; i < nGloVars; i++ )
        Gia_ManAppendCi( p->pGia );
    Gia_ManHashStart( p->pGia );
    return p;
}